

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::runQueryUniform
          (ExplicitUniformLocationCaseBase *this,CompiledProgram *program,Uniform *uniform,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *usedLocations,
          GLint max)

{
  Loc *this_00;
  int iVar1;
  GLuint GVar2;
  Uniform *this_01;
  bool bVar3;
  bool bVar4;
  _Rb_tree_color _Var5;
  _Rb_tree_color _Var6;
  pointer puVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Rb_tree_color _Var10;
  _Base_ptr p_Var11;
  pointer pUVar12;
  byte bVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  GLint expected;
  ostringstream name;
  ulong local_3e0;
  long *local_3d8;
  long local_3d0;
  long local_3c8 [2];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_3b8;
  ExplicitUniformLocationCaseBase *local_3b0;
  Uniform *local_3a8;
  GLint local_3a0;
  GLint local_39c;
  ulong local_398;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_390;
  _Base_ptr local_388;
  DefOccurence *local_380;
  DefOccurence *local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_370;
  undefined1 local_358 [8];
  ostream local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_3b8 = &usedLocations->_M_t;
  if ((uniform->type).baseType == 0) {
    pUVar12 = (uniform->childUniforms).
              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((uniform->childUniforms).
        super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
        ._M_impl.super__Vector_impl_data._M_finish != pUVar12) {
      lVar15 = 0;
      local_3e0 = 0;
      uVar16 = 0;
      local_3b0 = this;
      do {
        uVar9 = runQueryUniform(local_3b0,program,
                                (Uniform *)((long)&(pUVar12->type).enumType + lVar15),
                                (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)local_3b8,max);
        local_3e0 = local_3e0 | uVar9;
        uVar16 = uVar16 + 1;
        pUVar12 = (uniform->childUniforms).
                  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = lVar15 + 0x1d8;
      } while (uVar16 < (ulong)(((long)(uniform->childUniforms).
                                       super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar12 >>
                                3) * -0x34115b1e5f75270d));
      return local_3e0;
    }
  }
  else {
    uVar16 = 0;
    local_39c = 0;
    if (0 < max) {
      local_39c = max;
    }
    if (0 < (uniform->type).arraySize) {
      this_00 = &uniform->location;
      __x = &program->stages;
      local_3b0 = (ExplicitUniformLocationCaseBase *)
                  &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
      local_378 = &uniform->declOccurence;
      local_380 = &uniform->usageOccurence;
      local_388 = &(usedLocations->_M_t)._M_impl.super__Rb_tree_header._M_header;
      local_3e0 = 0;
      local_3a8 = uniform;
      local_3a0 = max;
      local_390 = __x;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1c0,__x);
        bVar3 = LayoutSpecifierBase::isImplicit(&this_00->super_LayoutSpecifierBase,&local_1c0);
        if (local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = (uint)uVar16;
        _Var10 = (this_00->super_LayoutSpecifierBase).val + uVar14;
        if (bVar3) {
          _Var10 = ~_S_red;
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_370,__x);
        bVar3 = LayoutSpecifierBase::isImplicit(&this_00->super_LayoutSpecifierBase,&local_370);
        this_01 = local_3a8;
        local_398 = uVar16;
        if ((uVar14 < 1000) || (bVar3)) {
          if (local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_370.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_370.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_370.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
LAB_00bcae39:
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(this_01->name)._M_dataplus._M_p,
                     (this_01->name)._M_string_length);
          UniformType::streamArrayStr(&this_01->type,(ostringstream *)local_1a8,(int)local_398);
          GVar2 = program->name;
          std::__cxx11::stringbuf::str();
          _Var5 = glu::CallLogWrapper::glGetUniformLocation
                            ((CallLogWrapper *)local_3b0,GVar2,
                             (GLchar *)CONCAT44(local_358._4_4_,local_358._0_4_));
          if ((undefined1 *)CONCAT44(local_358._4_4_,local_358._0_4_) != &local_350.field_0x8) {
            operator_delete((undefined1 *)CONCAT44(local_358._4_4_,local_358._0_4_),
                            local_350._8_8_ + 1);
          }
          GVar2 = program->name;
          std::__cxx11::stringbuf::str();
          _Var6 = glu::CallLogWrapper::glGetProgramResourceLocation
                            ((CallLogWrapper *)local_3b0,GVar2,0x92e1,
                             (GLchar *)CONCAT44(local_358._4_4_,local_358._0_4_));
          if ((undefined1 *)CONCAT44(local_358._4_4_,local_358._0_4_) != &local_350.field_0x8) {
            operator_delete((undefined1 *)CONCAT44(local_358._4_4_,local_358._0_4_),
                            local_350._8_8_ + 1);
          }
          if (_Var5 != _Var6) {
            local_358._0_4_ = local_358._0_4_ & 0xffffff00;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,"Locations of  uniform \"",0x17);
            }
            std::__cxx11::stringbuf::str();
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,(char *)local_3d8,local_3d0);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,
                         "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                         ,0x53);
            }
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var5);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_350," != ",4);
            }
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var6);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_350,".",1);
            }
            if (local_3d8 != local_3c8) {
              operator_delete(local_3d8,local_3c8[0] + 1);
            }
            Logger::~Logger((Logger *)local_358);
            local_3e0 = -1;
          }
          puVar7 = (program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish == puVar7) {
            bVar13 = 0;
          }
          else {
            uVar16 = 0;
            bVar13 = 0;
            do {
              bVar3 = DefOccurence::occurs(local_378,puVar7[uVar16]);
              bVar4 = false;
              if (bVar3) {
                bVar4 = DefOccurence::occurs
                                  (local_380,
                                   (__x->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_start[uVar16]);
              }
              bVar13 = bVar13 | bVar4;
              uVar16 = uVar16 + 1;
              puVar7 = (program->stages).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            } while (uVar16 < (ulong)((long)(program->stages).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar7 >> 2));
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d8,__x);
          bVar3 = LayoutSpecifierBase::isImplicit(&this_00->super_LayoutSpecifierBase,&local_1d8);
          if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Var6 = _Var10;
          if (bVar3) {
            if ((bVar13 != 0) && (_Var6 = _Var5, (int)_Var5 < 0)) {
              local_358._0_4_ = (uint)(uint3)local_358._1_3_ << 8;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)local_358,(char (*) [21])"Unexpected uniform \"");
              std::__cxx11::stringbuf::str();
              if (local_358[0] == (Logger)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_350,(char *)local_3d8,local_3d0);
              }
              if (local_358[0] == (Logger)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (&local_350,"\" location: expected positive value, got ",0x29);
              }
              if (local_358[0] == (Logger)0x0) {
                std::ostream::operator<<((ostringstream *)&local_350,_Var5);
              }
              if (local_358[0] == (Logger)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>(&local_350,".",1);
              }
LAB_00bcb2f7:
              if (local_3d8 != local_3c8) {
                operator_delete(local_3d8,local_3c8[0] + 1);
              }
              Logger::~Logger((Logger *)local_358);
              local_3e0 = -1;
              _Var6 = _Var10;
            }
          }
          else if ((_Var10 != _Var5) && (_Var5 != ~_S_red || bVar13 != 0)) {
            local_358._0_4_ = (uint)(uint3)local_358._1_3_ << 8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [21])"Unexpected uniform \"");
            std::__cxx11::stringbuf::str();
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,(char *)local_3d8,local_3d0);
            }
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [22])"\" location: expected ");
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var10);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_350,", got ",6);
            }
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var5);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_350,".",1);
            }
            goto LAB_00bcb2f7;
          }
          _Var10 = _Var6;
          if (local_39c <= (int)_Var5) {
            local_358._0_4_ = local_358._0_4_ & 0xffffff00;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [10])0x1cf831a);
            std::__cxx11::stringbuf::str();
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,(char *)local_3d8,local_3d0);
            }
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [22])"\" returned location (");
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var5);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_350,") is greater than implementation dependent limit (",0x32);
            }
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,local_3a0);
            }
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [3])0x1cb501b);
            if (local_3d8 != local_3c8) {
              operator_delete(local_3d8,local_3c8[0] + 1);
            }
            Logger::~Logger((Logger *)local_358);
            local_3e0 = -1;
          }
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          iVar1 = (local_3a8->type).arraySize;
          if (local_370.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_370.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_370.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_370.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          __x = local_390;
          if (iVar1 + -1000 < (int)uVar14) goto LAB_00bcae39;
        }
        if (-1 < (int)_Var10) {
          p_Var8 = local_388;
          for (p_Var11 = (((_Rep_type *)&local_3b8->_M_impl)->_M_impl).super__Rb_tree_header.
                         _M_header._M_parent; p_Var11 != (_Base_ptr)0x0;
              p_Var11 = (&p_Var11->_M_left)[bVar3]) {
            bVar3 = p_Var11[1]._M_color < _Var10;
            if (!bVar3) {
              p_Var8 = p_Var11;
            }
          }
          p_Var11 = local_388;
          if ((p_Var8 != local_388) && (p_Var11 = p_Var8, _Var10 < p_Var8[1]._M_color)) {
            p_Var11 = local_388;
          }
          if (p_Var11 != local_388) {
            local_358._0_4_ = local_358._0_4_ & 0xffffff00;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
            glcts::(anonymous_namespace)::Logger::operator<<
                      ((Logger *)local_358,(char (*) [19])"Uniform location (");
            if (local_358[0] == (Logger)0x0) {
              std::ostream::operator<<(&local_350,_Var10);
            }
            if (local_358[0] == (Logger)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_350,") is not unique.",0x10)
              ;
            }
            Logger::~Logger((Logger *)local_358);
            local_3e0 = -1;
          }
          local_358._0_4_ = _Var10;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(local_3b8,(uint *)local_358);
        }
        uVar14 = (int)local_398 + 1;
        uVar16 = (ulong)uVar14;
        if ((local_3a8->type).arraySize <= (int)uVar14) {
          return local_3e0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

long runQueryUniform(const CompiledProgram& program, const Uniform& uniform, std::set<GLuint>& usedLocations,
						 GLint max)
	{
		long ret = NO_ERROR;

		/*
		 glGetUniformLocation(program, name);
		 Query passes if returned value is unique in current program, matches
		 explicit location (if passed in GLSL code) and is less than value of
		 GL_MAX_UNIFORM_LOCATIONS.

		 glGetProgramResourceLocation(program, GL_UNIFIORM, name);
		 Query passes if returned value matches value returned from
		 glGetUniformLocation().
		 */

		if (uniform.type.isStruct())
		{
			for (size_t i = 0; i < uniform.childUniforms.size(); i++)
			{
				ret |= runQueryUniform(program, uniform.childUniforms[i], usedLocations, max);
			}
		}
		else
		{
			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{

				/* Location that is taken by this uniform (even if not used).*/
				GLint reservedLocation = -1;
				if (!uniform.location.isImplicit(program.stages))
				{
					reservedLocation = uniform.location.val + arrayElem;
				}

				//optimization: for continuous arrays run queries at the beging and end only.
				bool runQueries = uniform.location.isImplicit(program.stages) ||
								  (arrayElem < 1000 || arrayElem > uniform.type.arraySize - 1000);

				if (runQueries)
				{
					std::ostringstream name;
					name << uniform.getName();
					uniform.type.streamArrayStr(name, arrayElem);
					GLint returned = glGetUniformLocation(program.name, name.str().c_str());

					GLint returnedPIQ = glGetProgramResourceLocation(program.name, GL_UNIFORM, name.str().c_str());

					if (returned != returnedPIQ)
					{
						ret |= ERROR;
						Logger()
							<< "Locations of  uniform \"" << name.str()
							<< "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
							<< returned << " != " << returnedPIQ << ".";
					}

					bool used = false;
					for (size_t i = 0; i < program.stages.size(); i++)
					{
						used |= uniform.declOccurence.occurs(program.stages[i]) &&
								uniform.usageOccurence.occurs(program.stages[i]);
					}

					if (!uniform.location.isImplicit(program.stages))
					{
						//Validate uniform location against explicit value
						GLint expected = reservedLocation;
						if (!(expected == returned || (!used && returned == -1)))
						{
							ret |= ERROR;
							Logger() << "Unexpected uniform \"" << name.str() << "\" location: expected " << expected
									 << ", got " << returned << ".";
						}
					}
					else
					{
						//Check if location > 0 if used;
						if (used)
						{
							if (returned < 0)
							{
								ret |= ERROR;
								Logger() << "Unexpected uniform \"" << name.str()
										 << "\" location: expected positive value, got " << returned << ".";
							}
							else
							{
								reservedLocation = returned;
							}
						}
					}

					if (returned >= 0)
					{
						//check if location is less than max

						if (returned >= max)
						{
							ret |= ERROR;
							Logger() << "Uniform \"" << name.str() << "\" returned location (" << returned
									 << ") is greater than implementation dependent limit (" << max << ").";
						}
					}
				} //if (runQueries)

				//usedLocations is always checked (even if queries were not run.
				if (reservedLocation >= 0)
				{
					//check if location is unique
					if (usedLocations.find(reservedLocation) != usedLocations.end())
					{
						ret |= ERROR;
						Logger() << "Uniform location (" << reservedLocation << ") is not unique.";
					}
					usedLocations.insert(reservedLocation);
				}
			}
		}
		return ret;
	}